

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O0

ExecutionState __thiscall
Js::FunctionExecutionStateMachine::ModeToState
          (FunctionExecutionStateMachine *this,ExecutionMode mode)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ExecutionMode mode_local;
  FunctionExecutionStateMachine *this_local;
  
  switch(mode) {
  case AutoProfilingInterpreter:
    this_local._7_1_ = AutoProfilingInterpreter0;
    break;
  case ProfilingInterpreter:
    this_local._7_1_ = ProfilingInterpreter0;
    break;
  case SimpleJit:
    this_local._7_1_ = SimpleJit;
    break;
  case FullJit:
    this_local._7_1_ = FullJit;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x1c0,"(!\"Unexpected ExecutionMode for ExecutionState\")",
                                "!\"Unexpected ExecutionMode for ExecutionState\"");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  case Interpreter:
    this_local._7_1_ = Interpreter;
  }
  return this_local._7_1_;
}

Assistant:

FunctionExecutionStateMachine::ExecutionState FunctionExecutionStateMachine::ModeToState(ExecutionMode mode) const
    {
        switch (mode)
        {
        case ExecutionMode::AutoProfilingInterpreter:
            return ExecutionState::AutoProfilingInterpreter0;

        case ExecutionMode::ProfilingInterpreter:
            return ExecutionState::ProfilingInterpreter0;

        case ExecutionMode::SimpleJit:
            return ExecutionState::SimpleJit;

        case ExecutionMode::FullJit:
            return ExecutionState::FullJit;

        default:
            Assert(!"Unexpected ExecutionMode for ExecutionState");
            // fall through
        case ExecutionMode::Interpreter:
            return ExecutionState::Interpreter;
        }
    }